

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RefCountedObject.h
# Opt level: O2

LineAndColumn __thiscall soul::CodeLocation::getLineAndColumn(CodeLocation *this)

{
  UnicodeChar UVar1;
  SourceCodeText *pSVar2;
  LineAndColumn LVar3;
  ulong uVar4;
  uint uVar5;
  UTF8Reader i;
  
  if ((this->sourceCode).object != (SourceCodeText *)0x0) {
    pSVar2 = RefCountedPtr<soul::SourceCodeText>::operator->(&this->sourceCode);
    i.data = (pSVar2->utf8).data;
    uVar4 = 1;
    uVar5 = 1;
    while ((i.data < (this->location).data && (*i.data != '\0'))) {
      uVar5 = uVar5 + 1;
      UVar1 = UTF8Reader::operator*(&i);
      if (UVar1 == 10) {
        uVar5 = 1;
      }
      uVar4 = (ulong)((int)uVar4 + (uint)(UVar1 == 10));
      UTF8Reader::operator++(&i);
    }
    return (LineAndColumn)(uVar4 | (ulong)uVar5 << 0x20);
  }
  LVar3.line = 0;
  LVar3.column = 0;
  return LVar3;
}

Assistant:

bool operator== (const ObjectType* other) const         { return object == other; }